

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree.c
# Opt level: O0

void test_write_format_mtree_sub2(int use_set,int dironly)

{
  uint uVar1;
  long lVar2;
  longlong v1;
  wchar_t wVar3;
  int iVar4;
  mode_t mVar5;
  mode_t mVar6;
  time_t tVar7;
  ulong uVar8;
  la_ssize_t v2;
  char *pcVar9;
  char *pcVar10;
  la_int64_t lVar11;
  char *local_70;
  char *o;
  char *r;
  char *p;
  char str [32];
  int local_2c;
  size_t sStack_28;
  int i;
  size_t used;
  archive *a;
  archive_entry *ae;
  int dironly_local;
  int use_set_local;
  
  ae._0_4_ = dironly;
  ae._4_4_ = use_set;
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'¨',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  wVar3 = archive_write_set_format_mtree((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'©',0,"ARCHIVE_OK",(long)wVar3,"archive_write_set_format_mtree(a)",
                      (void *)used);
  if (ae._4_4_ != 0) {
    iVar4 = archive_write_set_format_option((archive *)used,(char *)0x0,"use-set","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'«',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"use-set\", \"1\")",(void *)used)
    ;
  }
  if ((int)ae != 0) {
    iVar4 = archive_write_set_format_option((archive *)used,(char *)0x0,"dironly","1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'­',0,"ARCHIVE_OK",(long)iVar4,
                        "archive_write_set_format_option(a, NULL, \"dironly\", \"1\")",(void *)used)
    ;
  }
  iVar4 = archive_write_open_memory((archive *)used,buff,0xfff,&stack0xffffffffffffffd8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'®',0,"ARCHIVE_OK",(long)iVar4,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",(void *)used);
  local_2c = 0;
  while (entries2[local_2c].path != (char *)0x0) {
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'²',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime((archive_entry *)a,entries2[local_2c].mtime,0);
    lVar2 = entries2[local_2c].mtime;
    tVar7 = archive_entry_mtime((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'´',(uint)(lVar2 == tVar7),"entries2[i].mtime == archive_entry_mtime(ae)",
                     (void *)0x0);
    archive_entry_set_mode((archive_entry *)a,entries2[local_2c].mode);
    mVar6 = entries2[local_2c].mode;
    mVar5 = archive_entry_mode((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¶',(uint)(mVar6 == mVar5),"entries2[i].mode == archive_entry_mode(ae)",
                     (void *)0x0);
    archive_entry_set_uid((archive_entry *)a,(ulong)entries2[local_2c].uid);
    uVar1 = entries2[local_2c].uid;
    uVar8 = archive_entry_uid((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'¸',(uint)(uVar1 == uVar8),"entries2[i].uid == archive_entry_uid(ae)",
                     (void *)0x0);
    archive_entry_set_gid((archive_entry *)a,(ulong)entries2[local_2c].gid);
    uVar1 = entries2[local_2c].gid;
    uVar8 = archive_entry_gid((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'º',(uint)(uVar1 == uVar8),"entries2[i].gid == archive_entry_gid(ae)",
                     (void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,entries2[local_2c].path);
    if ((entries2[local_2c].mode & 0xf000) != 0x4000) {
      archive_entry_set_size((archive_entry *)a,8);
    }
    iVar4 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                        ,L'¾',0,"ARCHIVE_OK",(long)iVar4,"archive_write_header(a, ae)",(void *)used
                       );
    if ((entries2[local_2c].mode & 0xf000) != 0x4000) {
      v2 = archive_write_data((archive *)used,"Hello012",0xf);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'Á',8,"8",v2,"archive_write_data(a, \"Hello012\", 15)",(void *)used);
    }
    archive_entry_free((archive_entry *)a);
    local_2c = local_2c + 1;
  }
  iVar4 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar4,"archive_write_close(a)",(void *)used);
  iVar4 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar4,"archive_write_free(a)",(void *)0x0);
  if (ae._4_4_ != 0) {
    buff[sStack_28] = '\0';
    pcVar9 = strstr(buff,"\n/set ");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                     ,L'Ë',(uint)(pcVar9 != (char *)0x0),"NULL != (p = strstr(buff, \"\\n/set \"))"
                     ,(void *)0x0);
    if (pcVar9 != (char *)0x0) {
      pcVar10 = strchr(pcVar9 + 1,10);
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\0';
      }
      if ((int)ae == 0) {
        local_70 = "/set type=file uid=1001 gid=1001 mode=644";
      }
      else {
        local_70 = "/set type=dir uid=1001 gid=1001 mode=755";
      }
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'×',local_70,"o",pcVar9 + 1,"p",(void *)0x0,L'\0');
      if (pcVar10 != (char *)0x0) {
        *pcVar10 = '\n';
      }
    }
  }
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                   ,L'à',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar4 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'á',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar4 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar4 = archive_read_open_memory((archive *)used,buff,sStack_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar4,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  memset(&p,0,0x20);
  strcpy((char *)&p,"./");
  local_2c = 0;
  while (entries2[local_2c].path != (char *)0x0) {
    if (((int)ae == 0) || ((entries2[local_2c].mode & 0xf000) == 0x4000)) {
      iVar4 = archive_read_next_header((archive *)used,(archive_entry **)&a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ë',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                          (void *)used);
      v1 = entries2[local_2c].mtime;
      tVar7 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ì',v1,"entries2[i].mtime",tVar7,"archive_entry_mtime(ae)",(void *)0x0)
      ;
      uVar1 = entries2[local_2c].mode;
      mVar6 = archive_entry_mode((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'í',(ulong)uVar1,"entries2[i].mode",(ulong)mVar6,
                          "archive_entry_mode(ae)",(void *)0x0);
      uVar1 = entries2[local_2c].uid;
      lVar11 = archive_entry_uid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'î',(ulong)uVar1,"entries2[i].uid",lVar11,"archive_entry_uid(ae)",
                          (void *)0x0);
      uVar1 = entries2[local_2c].gid;
      lVar11 = archive_entry_gid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                          ,L'ï',(ulong)uVar1,"entries2[i].gid",lVar11,"archive_entry_gid(ae)",
                          (void *)0x0);
      strcpy((char *)((long)&p + 2),entries2[local_2c].path);
      pcVar9 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                 ,L'ñ',(char *)&p,"str",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      if ((entries2[local_2c].mode & 0xf000) != 0x4000) {
        lVar11 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                            ,L'ó',8,"8",lVar11,"archive_entry_size(ae)",(void *)0x0);
      }
    }
    local_2c = local_2c + 1;
  }
  iVar4 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'õ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",(void *)used);
  iVar4 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree.c"
                      ,L'ö',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_write_format_mtree_sub2(int use_set, int dironly)
{
  struct archive_entry *ae;
  struct archive* a;
  size_t used;
  int i;
  char str[32];

  /* Create a mtree format archive. */
  assert((a = archive_write_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
  if (use_set)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "use-set", "1"));
  if (dironly)
    assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_option(a, NULL, "dironly", "1"));
  assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

  /* Write entries2 */
  for (i = 0; entries2[i].path != NULL; i++) {
    assert((ae = archive_entry_new()) != NULL);
    archive_entry_set_mtime(ae, entries2[i].mtime, 0);
    assert(entries2[i].mtime == archive_entry_mtime(ae));
    archive_entry_set_mode(ae, entries2[i].mode);
    assert(entries2[i].mode == archive_entry_mode(ae));
    archive_entry_set_uid(ae, entries2[i].uid);
    assert(entries2[i].uid == archive_entry_uid(ae));
    archive_entry_set_gid(ae, entries2[i].gid);
    assert(entries2[i].gid == archive_entry_gid(ae));
    archive_entry_copy_pathname(ae, entries2[i].path);
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      archive_entry_set_size(ae, 8);
    assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualIntA(a, 8,
          archive_write_data(a, "Hello012", 15));
    archive_entry_free(ae);
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

  if (use_set) {
    const char *p;

    buff[used] = '\0';
    assert(NULL != (p = strstr(buff, "\n/set ")));
    if (p != NULL) {
      char *r;
      const char *o;
      p++;
      r = strchr(p, '\n');
      if (r != NULL)
        *r = '\0';
      if (dironly)
        o = "/set type=dir uid=1001 gid=1001 mode=755";
      else
        o = "/set type=file uid=1001 gid=1001 mode=644";
      assertEqualString(o, p);
      if (r != NULL)
        *r = '\n';
    }
  }

  /*
   * Read the data and check it.
   */
  assert((a = archive_read_new()) != NULL);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

  /* Read entries2 */
  memset(str, 0, sizeof(str));
  strcpy(str, "./");
  for (i = 0; entries2[i].path != NULL; i++) {
    if (dironly && (entries2[i].mode & AE_IFMT) != S_IFDIR)
      continue;
    assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
    assertEqualInt(entries2[i].mtime, archive_entry_mtime(ae));
    assertEqualInt(entries2[i].mode, archive_entry_mode(ae));
    assertEqualInt(entries2[i].uid, archive_entry_uid(ae));
    assertEqualInt(entries2[i].gid, archive_entry_gid(ae));
    strcpy(str + 2, entries2[i].path);
    assertEqualString(str, archive_entry_pathname(ae));
    if ((entries2[i].mode & AE_IFMT) != S_IFDIR)
      assertEqualInt(8, archive_entry_size(ae));
  }
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}